

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void toml::detail::
     throw_key_not_found_error<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,key *ky)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  uint_least32_t uVar1;
  out_of_range *poVar2;
  char (*in_R8) [35];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_371;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_370;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  iterator local_2f8;
  size_type local_2f0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  string local_2d0;
  string local_2b0;
  undefined1 local_289;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_261;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  iterator local_1e8;
  size_type local_1e0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  string local_1c0;
  string local_1a0;
  undefined1 local_179;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_159;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_158;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  iterator local_e0;
  size_type local_d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  source_location loc;
  key *ky_local;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v_local;
  
  loc.line_str_.field_2._8_8_ = ky;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
            ((source_location *)local_68,v);
  uVar1 = source_location::line((source_location *)local_68);
  if (uVar1 == 1) {
    uVar1 = source_location::region((source_location *)local_68);
    if (uVar1 == 0) {
      local_179 = 1;
      poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
      concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[35]>
                (&local_a8,(toml *)"key \"",(char (*) [6])loc.line_str_.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\" not found in the top-level table",in_R8);
      local_158 = &local_150;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[25],_true>
                (local_158,(source_location *)local_68,(char (*) [25])"the parsed file is empty");
      local_e0 = &local_150;
      local_d8 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_159);
      __l_01._M_len = local_d8;
      __l_01._M_array = local_e0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_d0,__l_01,&local_159);
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_178);
      format_underline(&local_88,&local_a8,&local_d0,&local_178,false);
      std::out_of_range::out_of_range(poVar2,(string *)&local_88);
      local_179 = 0;
      __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  uVar1 = source_location::line((source_location *)local_68);
  if (uVar1 == 1) {
    uVar1 = source_location::region((source_location *)local_68);
    if (uVar1 == 1) {
      local_289 = 1;
      poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
      concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[35]>
                (&local_1c0,(toml *)"key \"",(char (*) [6])loc.line_str_.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\" not found in the top-level table",in_R8);
      local_260 = &local_258;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[32],_true>
                (local_260,(source_location *)local_68,
                 (char (*) [32])"the top-level table starts here");
      local_1e8 = &local_258;
      local_1e0 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_261);
      __l_00._M_len = local_1e0;
      __l_00._M_array = local_1e8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_1d8,__l_00,&local_261);
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_288);
      format_underline(&local_1a0,&local_1c0,&local_1d8,&local_288,false);
      std::out_of_range::out_of_range(poVar2,(string *)&local_1a0);
      local_289 = 0;
      __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
  concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[12]>
            (&local_2d0,(toml *)"key \"",(char (*) [6])loc.line_str_.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\" not found",
             (char (*) [12])in_R8);
  local_370 = &local_368;
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (local_370,(source_location *)local_68,(char (*) [14])"in this table");
  local_2f8 = &local_368;
  local_2f0 = 1;
  std::
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_371);
  __l._M_len = local_2f0;
  __l._M_array = local_2f8;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2e8,__l,&local_371);
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_398);
  format_underline(&local_2b0,&local_2d0,&local_2e8,&local_398,false);
  std::out_of_range::out_of_range(poVar2,(string *)&local_2b0);
  __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

[[noreturn]] void
throw_key_not_found_error(const Value& v, const key& ky)
{
    // The top-level table has its region at the first character of the file.
    // That means that, in the case when a key is not found in the top-level
    // table, the error message points to the first character. If the file has
    // its first table at the first line, the error message would be like this.
    // ```console
    // [error] key "a" not found
    //  --> example.toml
    //    |
    //  1 | [table]
    //    | ^------ in this table
    // ```
    // It actually points to the top-level table at the first character,
    // not `[table]`. But it is too confusing. To avoid the confusion, the error
    // message should explicitly say "key not found in the top-level table",
    // or "the parsed file is empty" if there is no content at all (0 bytes in file).
    const auto loc = v.location();
    if(loc.line() == 1 && loc.region() == 0)
    {
        // First line with a zero-length region means "empty file".
        // The region will be generated at `parse_toml_file` function
        // if the file contains no bytes.
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found in the top-level table"), {
                {loc, "the parsed file is empty"}
            }));
    }
    else if(loc.line() == 1 && loc.region() == 1)
    {
        // Here it assumes that top-level table starts at the first character.
        // The region corresponds to the top-level table will be generated at
        // `parse_toml_file` function.
        //     It also assumes that the top-level table size is just one and
        // the line number is `1`. It is always satisfied. And those conditions
        // are satisfied only if the table is the top-level table.
        //
        // 1. one-character dot-key at the first line
        // ```toml
        // a.b = "c"
        // ```
        // toml11 counts whole key as the table key. Here, `a.b` is the region
        // of the table "a". It could be counter intuitive, but it works.
        // The size of the region is 3, not 1. The above example is the shortest
        // dot-key example. The size cannot be 1.
        //
        // 2. one-character inline-table at the first line
        // ```toml
        // a = {b = "c"}
        // ```
        // toml11 considers the inline table body as the table region. Here,
        // `{b = "c"}` is the region of the table "a". The size of the region
        // is 9, not 1. The shotest inline table still has two characters, `{`
        // and `}`. The size cannot be 1.
        //
        // 3. one-character table declaration at the first line
        // ```toml
        // [a]
        // ```
        // toml11 considers the whole table key as the table region. Here,
        // `[a]` is the table region. The size is 3, not 1.
        //
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found in the top-level table"), {
                {loc, "the top-level table starts here"}
            }));
    }
    else
    {
        // normal table.
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found"), { {loc, "in this table"} }));
    }
}